

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

MemoryStream * __thiscall Assimp::Ogre::VertexData::VertexBuffer(VertexData *this,uint16_t source)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  element_type *peVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  key_type_conflict local_2;
  
  p_Var1 = &(this->vertexBindings)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
    bVar6 = (ushort)(short)p_Var5[1]._M_color < source;
    if (!bVar6) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, source < (ushort)(short)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    peVar3 = (MemoryStream *)0x0;
  }
  else {
    pmVar2 = std::
             map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
             ::operator[](&this->vertexBindings,&local_2);
    peVar3 = (pmVar2->super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
  }
  return peVar3;
}

Assistant:

MemoryStream *VertexData::VertexBuffer(uint16_t source)
{
    if (vertexBindings.find(source) != vertexBindings.end())
        return vertexBindings[source].get();
    return 0;
}